

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O2

int tnt_reply_len(char *buf,size_t size,size_t *len)

{
  uint uVar1;
  uint64_t uVar2;
  size_t sVar3;
  char *local_20;
  char *p;
  
  if (size < 5) {
    *len = 5 - size;
    uVar1 = 1;
  }
  else if (mp_type_hint[(byte)*buf] == MP_UINT) {
    local_20 = buf;
    uVar2 = mp_decode_uint(&local_20);
    uVar1 = (uint)(size < uVar2 + 5);
    sVar3 = 0;
    if (size < uVar2 + 5) {
      sVar3 = size;
    }
    *len = (uVar2 - sVar3) + 5;
  }
  else {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

static int
tnt_reply_len(const char *buf, size_t size, size_t *len)
{
	if (size < TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = TNT_REPLY_IPROTO_HDR_SIZE - size;
		return 1;
	}
	const char *p = buf;
	if (mp_typeof(*p) != MP_UINT)
		return -1;
	size_t length = mp_decode_uint(&p);
	if (size < length + TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = (length + TNT_REPLY_IPROTO_HDR_SIZE) - size;
		return 1;
	}
	*len = length + TNT_REPLY_IPROTO_HDR_SIZE;
	return 0;
}